

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QColorDialogPrivate::initHelper(QColorDialogPrivate *this,QPlatformDialogHelper *h)

{
  void **ppvVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  QObject local_68 [8];
  code *local_60;
  ImplFn local_58;
  Connection local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppvVar1 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_60 = QColorDialog::currentColorChanged;
  local_58 = (ImplFn)0x0;
  local_48 = QPlatformColorDialogHelper::currentColorChanged;
  local_40 = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QCallableObject<void_(QColorDialog::*)(const_QColor_&),_QtPrivate::List<const_QColor_&>,_void>
       ::impl;
  *(code **)(puVar2 + 4) = QColorDialog::currentColorChanged;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_50,(void **)h,(QObject *)&local_48,ppvVar1,
             (QSlotObjectBase *)&local_60,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_50);
  local_60 = QColorDialog::colorSelected;
  local_58 = (ImplFn)0x0;
  local_48 = QPlatformColorDialogHelper::colorSelected;
  local_40 = 0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QCallableObject<void_(QColorDialog::*)(const_QColor_&),_QtPrivate::List<const_QColor_&>,_void>
       ::impl;
  *(code **)(puVar2 + 4) = QColorDialog::colorSelected;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)h,(QObject *)&local_48,ppvVar1,(QSlotObjectBase *)&local_60,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QPlatformColorDialogHelper::setOptions((QSharedPointer *)h);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::initHelper(QPlatformDialogHelper *h)
{
    QColorDialog *d = q_func();
    auto *colorDialogHelper = static_cast<QPlatformColorDialogHelper*>(h);
    QObject::connect(colorDialogHelper, &QPlatformColorDialogHelper::currentColorChanged,
                     d, &QColorDialog::currentColorChanged);
    QObject::connect(colorDialogHelper, &QPlatformColorDialogHelper::colorSelected,
                     d, &QColorDialog::colorSelected);
    colorDialogHelper->setOptions(options);
}